

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog
                      )

{
  void *buffer;
  void *dst_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  char cVar12;
  char cVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong srcSize;
  BYTE *ostart;
  char *pcVar21;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar33 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar34 [32];
  BYTE bitsToWeight [13];
  S16 norm [13];
  uint count [13];
  BYTE huffWeight [255];
  BYTE scratchBuffer [64];
  FSE_CTable CTable_1 [59];
  char local_2f9 [13];
  undefined4 local_2ec;
  undefined8 local_2e8;
  undefined8 local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  short local_2c8 [16];
  uint local_2a8 [16];
  char local_268 [256];
  undefined1 local_168 [64];
  FSE_CTable local_128 [62];
  undefined1 auVar23 [32];
  
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  local_2f9[0] = '\0';
  uVar14 = huffLog + 1;
  if (1 < uVar14) {
    lVar18 = (ulong)uVar14 - 2;
    auVar22._8_8_ = lVar18;
    auVar22._0_8_ = lVar18;
    auVar23._16_8_ = lVar18;
    auVar23._0_16_ = auVar22;
    auVar23._24_8_ = lVar18;
    lVar18 = 0;
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x17161514));
    auVar4 = vpmovsxbq_avx2(ZEXT416(0x13121110));
    auVar5 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
    auVar6 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
    auVar7 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar32._8_8_ = 0x8000000000000000;
    auVar32._0_8_ = 0x8000000000000000;
    auVar1 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
    auVar33._8_8_ = 0x8000000000000000;
    auVar33._0_8_ = 0x8000000000000000;
    auVar33._16_8_ = 0x8000000000000000;
    auVar33._24_8_ = 0x8000000000000000;
    auVar2 = vpcmpeqd_avx2(in_ZMM12._0_32_,in_ZMM12._0_32_);
    lVar20 = 0;
    do {
      auVar34._8_8_ = lVar20;
      auVar34._0_8_ = lVar20;
      auVar34._16_8_ = lVar20;
      auVar34._24_8_ = lVar20;
      auVar9 = vpor_avx2(auVar34,auVar8);
      auVar24 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      cVar12 = (char)huffLog;
      cVar13 = (char)lVar18;
      if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 1] = cVar12 + cVar13;
      }
      auVar24 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 2] = cVar12 + cVar13 + -1;
      }
      auVar11 = auVar33 ^ auVar23;
      auVar9 = vpcmpgtq_avx2(auVar9 ^ auVar33,auVar11);
      auVar10 = vpshuflw_avx2(auVar9,0xe8);
      auVar24._0_4_ = auVar10._16_4_;
      auVar24._4_4_ = auVar24._0_4_;
      auVar24._8_4_ = auVar24._0_4_;
      auVar24._12_4_ = auVar24._0_4_;
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 3] = cVar12 + cVar13 + -2;
      }
      auVar24 = vpackssdw_avx(auVar9._16_16_,auVar9._16_16_);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 4] = cVar12 + cVar13 + -3;
      }
      auVar10 = vpor_avx2(auVar34,auVar7);
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar9 = vpermq_avx2(ZEXT1632(auVar1 ^ auVar24),0x55);
      auVar9 = vpackssdw_avx2(auVar9,auVar23);
      auVar25._0_2_ = auVar9._16_2_;
      auVar25._2_2_ = auVar25._0_2_;
      auVar25._4_2_ = auVar25._0_2_;
      auVar25._6_2_ = auVar25._0_2_;
      auVar25._8_2_ = auVar25._0_2_;
      auVar25._10_2_ = auVar25._0_2_;
      auVar25._12_2_ = auVar25._0_2_;
      auVar25._14_2_ = auVar25._0_2_;
      auVar24 = vpacksswb_avx(auVar25,auVar25);
      if ((auVar24 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 5] = cVar12 + cVar13 + -4;
      }
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpshufhw_avx(auVar24,0x84);
      auVar9 = vpermq_avx2(ZEXT1632(auVar1 ^ auVar24),0x55);
      auVar9 = vpackssdw_avx2(auVar9,auVar23);
      auVar26._0_4_ = auVar9._16_4_;
      auVar26._4_4_ = auVar26._0_4_;
      auVar26._8_4_ = auVar26._0_4_;
      auVar26._12_4_ = auVar26._0_4_;
      auVar24 = vpacksswb_avx(auVar26,auVar26);
      if ((auVar24 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 6] = cVar12 + cVar13 + -5;
      }
      auVar10 = vpcmpgtq_avx2(auVar10 ^ auVar33,auVar11);
      auVar9 = vpackssdw_avx2(auVar23,auVar10);
      auVar24 = auVar1 ^ auVar9._16_16_;
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 7] = cVar12 + cVar13 + -6;
      }
      auVar9 = vpshufhw_avx2(auVar10,0x84);
      auVar24 = auVar1 ^ auVar9._16_16_;
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 8] = cVar12 + cVar13 + -7;
      }
      auVar10 = vpor_avx2(auVar34,auVar6);
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar9 = vpmovzxwd_avx2(auVar24);
      auVar9 = vpacksswb_avx2(auVar9,auVar23);
      if ((auVar9 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
        local_2f9[lVar20 + 9] = cVar12 + cVar13 + -8;
      }
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar9 = vpermq_avx2(ZEXT1632(auVar24),0x55);
      auVar9 = vpacksswb_avx2(auVar9,auVar23);
      if ((auVar9._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 10] = cVar12 + cVar13 + -9;
      }
      auVar10 = vpcmpgtq_avx2(auVar10 ^ auVar33,auVar11);
      auVar9 = vpshuflw_avx2(auVar10,0xe8);
      auVar27._0_4_ = auVar9._16_4_;
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar24 = vpackssdw_avx(auVar1 ^ auVar27,auVar1 ^ auVar27);
      auVar9 = vpermq_avx2(ZEXT1632(auVar24),0x55);
      auVar9 = vpacksswb_avx2(auVar9,auVar23);
      if ((auVar9._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 0xb] = cVar12 + cVar13 + -10;
      }
      auVar24 = vpackssdw_avx(auVar10._16_16_,auVar10._16_16_);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar9 = vpermq_avx2(ZEXT1632(auVar24),0x55);
      auVar9 = vpacksswb_avx2(auVar9,auVar23);
      if ((auVar9._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2f9[lVar20 + 0xc] = cVar12 + cVar13 + -0xb;
      }
      auVar10 = vpor_avx2(auVar34,auVar5);
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar9 = vpermq_avx2(ZEXT1632(auVar1 ^ auVar24),0x55);
      auVar9 = vpackssdw_avx2(auVar23,auVar9);
      auVar9 = vpacksswb_avx2(auVar9,auVar23);
      if ((auVar9._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2ec + lVar20) = cVar12 + cVar13 + -0xc;
      }
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpshufhw_avx(auVar24,0x84);
      auVar9 = vpermq_avx2(ZEXT1632(auVar1 ^ auVar24),0x55);
      auVar9 = vpackssdw_avx2(auVar23,auVar9);
      auVar9 = vpacksswb_avx2(auVar9,auVar23);
      if ((auVar9._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2ec + lVar20 + 1) = cVar12 + cVar13 + -0xd;
      }
      auVar10 = vpcmpgtq_avx2(auVar10 ^ auVar33,auVar11);
      auVar9 = vpackssdw_avx2(auVar23,auVar10);
      auVar9 = vpackssdw_avx2(auVar23,auVar2 ^ auVar9);
      auVar9 = vpacksswb_avx2(auVar9,auVar23);
      if ((auVar9._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2ec + lVar20 + 2) = cVar12 + cVar13 + -0xe;
      }
      auVar9 = vpshufhw_avx2(auVar10,0x84);
      auVar9 = vpackssdw_avx2(auVar23,auVar2 ^ auVar9);
      auVar9 = vpacksswb_avx2(auVar9,auVar23);
      if ((auVar9._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2ec + lVar20 + 3) = cVar12 + cVar13 + -0xf;
      }
      auVar9 = vpor_avx2(auVar34,auVar4);
      auVar24 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e8 + lVar20) = cVar12 + cVar13 + -0x10;
      }
      auVar24 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e8 + lVar20 + 1) = cVar12 + cVar13 + -0x11;
      }
      auVar9 = vpcmpgtq_avx2(auVar9 ^ auVar33,auVar11);
      auVar10 = vpshuflw_avx2(auVar9,0xe8);
      auVar28._0_4_ = auVar10._16_4_;
      auVar28._4_4_ = auVar28._0_4_;
      auVar28._8_4_ = auVar28._0_4_;
      auVar28._12_4_ = auVar28._0_4_;
      auVar24 = vpackssdw_avx(auVar1 ^ auVar28,auVar1 ^ auVar28);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e8 + lVar20 + 2) = cVar12 + cVar13 + -0x12;
      }
      auVar24 = vpackssdw_avx(auVar9._16_16_,auVar9._16_16_);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e8 + lVar20 + 3) = cVar12 + cVar13 + -0x13;
      }
      auVar10 = vpor_avx2(auVar34,auVar3);
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar9 = vpermq_avx2(ZEXT1632(auVar1 ^ auVar24),0x55);
      auVar9 = vpackssdw_avx2(auVar9,auVar23);
      auVar29._0_2_ = auVar9._16_2_;
      auVar29._2_2_ = auVar29._0_2_;
      auVar29._4_2_ = auVar29._0_2_;
      auVar29._6_2_ = auVar29._0_2_;
      auVar29._8_2_ = auVar29._0_2_;
      auVar29._10_2_ = auVar29._0_2_;
      auVar29._12_2_ = auVar29._0_2_;
      auVar29._14_2_ = auVar29._0_2_;
      auVar24 = vpacksswb_avx(auVar29,auVar29);
      if ((auVar24 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e8 + lVar20 + 4) = cVar12 + cVar13 + -0x14;
      }
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpshufhw_avx(auVar24,0x84);
      auVar9 = vpermq_avx2(ZEXT1632(auVar1 ^ auVar24),0x55);
      auVar9 = vpackssdw_avx2(auVar9,auVar23);
      auVar30._0_4_ = auVar9._16_4_;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      auVar24 = vpacksswb_avx(auVar30,auVar30);
      if ((auVar24 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e8 + lVar20 + 5) = cVar12 + cVar13 + -0x15;
      }
      auVar10 = vpcmpgtq_avx2(auVar10 ^ auVar33,auVar11);
      auVar9 = vpackssdw_avx2(auVar23,auVar10);
      auVar24 = auVar1 ^ auVar9._16_16_;
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e8 + lVar20 + 6) = cVar12 + cVar13 + -0x16;
      }
      auVar9 = vpshufhw_avx2(auVar10,0x84);
      auVar24 = auVar1 ^ auVar9._16_16_;
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      if ((auVar24 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e8 + lVar20 + 7) = cVar12 + cVar13 + -0x17;
      }
      auVar10 = vpor_avx2(auVar34,_DAT_001b3740);
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar9 = vpmovzxwd_avx2(auVar24);
      auVar9 = vpacksswb_avx2(auVar23,auVar9);
      if ((auVar9 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
        *(char *)((long)&local_2e0 + lVar20) = cVar12 + cVar13 + -0x18;
      }
      auVar24 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar9 = vpermq_avx2(ZEXT1632(auVar24),0x55);
      auVar9 = vpacksswb_avx2(auVar23,auVar9);
      if ((auVar9._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar20 + 1) = cVar12 + cVar13 + -0x19;
      }
      auVar10 = vpcmpgtq_avx2(auVar10 ^ auVar33,auVar11);
      auVar9 = vpshuflw_avx2(auVar10,0xe8);
      auVar31._0_4_ = auVar9._16_4_;
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
      auVar24 = vpackssdw_avx(auVar1 ^ auVar31,auVar1 ^ auVar31);
      auVar9 = vpermq_avx2(ZEXT1632(auVar24),0x55);
      auVar9 = vpacksswb_avx2(auVar23,auVar9);
      if ((auVar9._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar20 + 2) = cVar12 + cVar13 + -0x1a;
      }
      auVar24 = vpackssdw_avx(auVar10._16_16_,auVar10._16_16_);
      auVar24 = vpackssdw_avx(auVar1 ^ auVar24,auVar1 ^ auVar24);
      auVar9 = vpermq_avx2(ZEXT1632(auVar24),0x55);
      auVar9 = vpacksswb_avx2(auVar23,auVar9);
      if ((auVar9._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar20 + 3) = cVar12 + cVar13 + -0x1b;
      }
      auVar34 = vpor_avx2(auVar34,_DAT_001b3720);
      auVar24 = vpcmpgtq_avx(auVar34._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpackssdw_avx(auVar24,auVar24);
      auVar9 = vpermq_avx2(ZEXT1632(auVar1 ^ auVar24),0x55);
      auVar9 = vpackssdw_avx2(auVar23,auVar9);
      auVar9 = vpacksswb_avx2(auVar23,auVar9);
      if ((auVar9._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar20 + 4) = cVar12 + cVar13 + -0x1c;
      }
      auVar24 = vpcmpgtq_avx(auVar34._0_16_ ^ auVar32,auVar32 ^ auVar22);
      auVar24 = vpshufhw_avx(auVar24,0x84);
      auVar9 = vpermq_avx2(ZEXT1632(auVar1 ^ auVar24),0x55);
      auVar9 = vpackssdw_avx2(auVar23,auVar9);
      auVar9 = vpacksswb_avx2(auVar23,auVar9);
      if ((auVar9._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar20 + 5) = cVar12 + cVar13 + -0x1d;
      }
      auVar34 = vpcmpgtq_avx2(auVar34 ^ auVar33,auVar11);
      auVar9 = vpackssdw_avx2(auVar23,auVar34);
      auVar9 = vpackssdw_avx2(auVar23,auVar2 ^ auVar9);
      auVar9 = vpacksswb_avx2(auVar23,auVar9);
      if ((auVar9._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar20 + 6) = cVar12 + cVar13 + -0x1e;
      }
      auVar9 = vpshufhw_avx2(auVar34,0x84);
      auVar9 = vpackssdw_avx2(auVar23,auVar2 ^ auVar9);
      auVar9 = vpacksswb_avx2(auVar23,auVar9);
      if ((auVar9._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar20 + 7) = cVar12 + cVar13 + -0x1f;
      }
      lVar20 = lVar20 + 0x20;
      lVar18 = lVar18 + -0x20;
    } while (-lVar18 != ((ulong)uVar14 + 0x1e & 0xffffffffffffffe0));
  }
  local_2e0 = (char *)dst;
  if (maxSymbolValue == 0) {
    srcSize = 0;
  }
  else {
    srcSize = (ulong)maxSymbolValue;
    uVar16 = 0;
    do {
      local_268[uVar16] = local_2f9[CTable[uVar16].nbBits];
      uVar16 = uVar16 + 1;
    } while (srcSize != uVar16);
    buffer = (void *)((long)dst + 1);
    local_2ec = 0xc;
    if ((maxSymbolValue != 1) &&
       (uVar15 = HIST_count_simple(local_2a8,&local_2ec,local_268,srcSize), uVar14 = local_2ec,
       uVar15 != 1 && uVar15 != maxSymbolValue)) {
      local_2e8 = maxDstSize;
      uVar15 = FSE_optimalTableLog_internal(6,srcSize,local_2ec,2);
      sVar17 = FSE_normalizeCount(local_2c8,uVar15,local_2a8,srcSize,uVar14);
      if (0xffffffffffffff88 < sVar17) {
        return sVar17;
      }
      sVar17 = local_2e8 - 1;
      local_2d8 = FSE_writeNCount(buffer,sVar17,local_2c8,uVar14,uVar15);
      if (0xffffffffffffff88 < local_2d8) {
        return local_2d8;
      }
      local_2d0 = sVar17;
      sVar17 = FSE_buildCTable_wksp(local_128,local_2c8,uVar14,uVar15,local_168,0x40);
      if (0xffffffffffffff88 < sVar17) {
        return sVar17;
      }
      dst_00 = (void *)(local_2d8 + (long)buffer);
      sVar17 = FSE_compress_usingCTable_generic
                         (dst_00,local_2d0 - local_2d8,local_268,srcSize,local_128,
                          (uint)((maxSymbolValue >> 7) + srcSize + 0xc <= local_2d0 - local_2d8));
      if (0xffffffffffffff88 < sVar17) {
        return sVar17;
      }
      maxDstSize = local_2e8;
      if (sVar17 != 0) {
        uVar16 = (long)dst_00 + (sVar17 - (long)buffer);
        if (0xffffffffffffff88 < uVar16) {
          return uVar16;
        }
        local_2e0 = local_2e0;
        if (uVar16 < maxSymbolValue >> 1 && 1 < uVar16) {
          *local_2e0 = (char)uVar16;
          return uVar16 + 1;
        }
      }
    }
  }
  pcVar21 = (char *)((long)dst + 1);
  uVar16 = 0xffffffffffffffff;
  if (maxSymbolValue < 0x81) {
    uVar19 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
    uVar16 = 0xffffffffffffffba;
    if (uVar19 <= maxDstSize) {
      *local_2e0 = (char)maxSymbolValue + '\x7f';
      local_268[srcSize] = '\0';
      uVar16 = uVar19;
      if (maxSymbolValue != 0) {
        uVar19 = 0;
        do {
          *pcVar21 = local_268[uVar19] * '\x10' + local_268[uVar19 + 1];
          uVar19 = uVar19 + 2;
          pcVar21 = pcVar21 + 1;
        } while (uVar19 < srcSize);
      }
    }
  }
  return uVar16;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}